

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  Module *this_00;
  Location local_b0;
  undefined1 local_90 [48];
  Var start;
  Index func_index_local;
  BinaryReaderIR *this_local;
  
  start.field_2._28_4_ = func_index;
  GetLocation((Location *)(local_90 + 8),this);
  Var::Var((Var *)(local_90 + 0x28),func_index,(Location *)(local_90 + 8));
  this_00 = this->module_;
  GetLocation(&local_b0,this);
  std::make_unique<wabt::StartModuleField,wabt::Var&,wabt::Location>
            ((Var *)local_90,(Location *)(local_90 + 0x28));
  Module::AppendField(this_00,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                               *)local_90);
  std::unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>::~unique_ptr
            ((unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> *)
             local_90);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Var::~Var((Var *)(local_90 + 0x28));
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  Var start(func_index, GetLocation());
  module_->AppendField(
      std::make_unique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}